

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_subasi(runtime_type *this,var *a,var *b)

{
  undefined8 in_RSI;
  undefined1 raw;
  proxy *in_RDI;
  any *unaff_retaddr;
  var *in_stack_00000028;
  var *in_stack_00000030;
  proxy *this_00;
  proxy *obj;
  
  raw = (undefined1)((ulong)in_RSI >> 0x38);
  this_00 = in_RDI;
  obj = in_RDI;
  parse_sub((runtime_type *)b,in_stack_00000030,in_stack_00000028);
  cs_impl::any::swap(unaff_retaddr,(any *)obj,(bool)raw);
  cs_impl::any::~any((any *)0x1da522);
  cs_impl::any::any((any *)this_00,(any *)in_RDI);
  return (var)this_00;
}

Assistant:

var runtime_type::parse_subasi(var a, const var &b)
	{
		a.swap(parse_sub(a, b), true);
		return a;
	}